

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_sum.hpp
# Opt level: O0

void __thiscall
ranges::
partial_sum_view<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>,_std::plus<void>_>
::cursor<false>::next(cursor<false> *this)

{
  plus<void> *f_00;
  bool bVar1;
  int iVar2;
  basic_iterator<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
  *left;
  const_reference_t args_1;
  F *f;
  range_value_t<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>_>
  *sum;
  _result_t<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>_&>
  last;
  cursor<false> *this_local;
  
  last.
  super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
  .
  super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_void>
  .
  super_mixin_base_t<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
  .
  super_box<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
  .value.its_.index_ = (size_t)this;
  _end_::fn::
  operator()<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>_&>
            ((_result_t<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>_&>
              *)&sum,(fn *)&_::end,&this->parent_->base_);
  bVar1 = operator!=<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
                    (&this->current_,
                     (basic_iterator<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
                      *)&sum);
  if (bVar1) {
    left = basic_iterator<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
           ::operator++(&this->current_);
    bVar1 = operator!=<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
                      (left,(basic_iterator<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
                             *)&sum);
    if (bVar1) {
      f_00 = (plus<void> *)this->parent_;
      args_1 = basic_iterator<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
               ::operator*(&this->current_);
      iVar2 = invoke_fn::operator()((invoke_fn *)&invoke,f_00,&this->sum_,args_1);
      this->sum_ = iVar2;
    }
    return;
  }
  __assert_fail("current_ != last",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/furkankirac[P]cs321-2020-21-fall/range-v3/include/range/v3/view/partial_sum.hpp"
                ,0x79,
                "void ranges::partial_sum_view<ranges::concat_view<ranges::single_view<int>, ranges::ref_view<std::array<int, 12>>>, std::plus<void>>::cursor<false>::next() [Rng = ranges::concat_view<ranges::single_view<int>, ranges::ref_view<std::array<int, 12>>>, Fun = std::plus<void>, IsConst = false]"
               );
}

Assistant:

constexpr void next()
            {
                auto last = ranges::end(parent_->base_);
                RANGES_EXPECT(current_ != last);
                if(++current_ != last)
                {
                    auto & sum = static_cast<range_value_t<Rng> &>(sum_);
                    using F = meta::const_if_c<IsConst, Fun>;
                    auto & f = static_cast<F &>(parent_->fun_);
                    sum = invoke(f, sum, *current_);
                }
            }